

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * absl::lts_20250127::StrCat<google::protobuf::Edition>
                   (string *__return_storage_ptr__,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,
                   AlphaNum *e,Edition *args)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string local_f8;
  AlphaNum local_d8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view *local_48;
  undefined8 local_40;
  AlphaNum *local_38;
  AlphaNum *e_local;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  
  local_38 = e;
  e_local = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)__return_storage_ptr__;
  local_a8 = AlphaNum::Piece(a);
  local_98 = AlphaNum::Piece(c_local);
  local_88 = AlphaNum::Piece(d_local);
  local_78 = AlphaNum::Piece(e_local);
  local_68 = AlphaNum::Piece(local_38);
  local_f8.field_2._M_allocated_capacity = 0;
  local_f8.field_2._8_8_ = 0;
  local_f8._M_dataplus = (_Alloc_hider)0x0;
  local_f8._1_7_ = 0;
  local_f8._M_string_length = 0;
  strings_internal::StringifySink::StringifySink((StringifySink *)&local_f8);
  AlphaNum::AlphaNum<google::protobuf::Edition,void>(&local_d8,args,(StringifySink *)&local_f8);
  local_58 = AlphaNum::Piece(&local_d8);
  local_48 = &local_a8;
  local_40 = 6;
  pieces._M_len = local_58._M_len;
  pieces._M_array = (iterator)0x6;
  strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,(strings_internal *)local_48,pieces)
  ;
  strings_internal::StringifySink::~StringifySink((StringifySink *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}